

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sampling.h
# Opt level: O0

PLSample __thiscall
pbrt::PiecewiseLinear2D<2UL>::Sample(PiecewiseLinear2D<2UL> *this,Vector2f sample,Float *param)

{
  PLSample PVar1;
  float *pfVar2;
  size_t sVar3;
  const_reference pvVar4;
  const_reference pvVar5;
  size_t sVar6;
  long in_RSI;
  uint32_t uVar7;
  Tuple2<pbrt::Vector2,_int> *in_RDI;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  double dVar14;
  undefined1 auVar15 [16];
  undefined1 in_ZMM0 [64];
  float c1;
  float c0;
  float v11;
  float v01;
  float v10;
  float v00;
  uint32_t col;
  anon_class_40_5_7795fd69 fetch_conditional;
  bool is_const;
  float r1;
  float r0;
  uint32_t slice_size;
  uint32_t row;
  anon_class_24_3_1cc003bc fetch_marginal;
  uint32_t offset;
  float p1;
  float p0;
  uint32_t param_index;
  size_t dim;
  uint32_t slice_offset;
  float param_weight [4];
  float in_stack_fffffffffffffea8;
  float in_stack_fffffffffffffeac;
  undefined4 in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb4;
  float local_148;
  uint32_t in_stack_fffffffffffffebc;
  undefined4 in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffec4;
  float in_stack_fffffffffffffec8;
  undefined4 in_stack_fffffffffffffecc;
  PiecewiseLinear2D<2UL> *in_stack_fffffffffffffee0;
  ulong local_48;
  float local_38 [4];
  long local_28;
  Tuple2<pbrt::Vector2,_float> local_14;
  Tuple2<pbrt::Vector2,_float> local_c;
  
  local_14 = (Tuple2<pbrt::Vector2,_float>)vmovlpd_avx(in_ZMM0._0_16_);
  local_28 = in_RSI;
  pfVar2 = Tuple2<pbrt::Vector2,_float>::operator[](&local_14,0);
  fVar8 = Clamp<float,float,float>(*pfVar2,5.9604645e-08,0.99999994);
  pfVar2 = Tuple2<pbrt::Vector2,_float>::operator[](&local_14,0);
  *pfVar2 = fVar8;
  pfVar2 = Tuple2<pbrt::Vector2,_float>::operator[](&local_14,1);
  fVar9 = Clamp<float,float,float>(*pfVar2,5.9604645e-08,0.99999994);
  pfVar2 = Tuple2<pbrt::Vector2,_float>::operator[](&local_14,1);
  *pfVar2 = fVar9;
  for (local_48 = 0; local_48 < 2; local_48 = local_48 + 1) {
    if ((&in_RDI[3].x)[local_48] == 1) {
      local_38[local_48 * 2] = 1.0;
      local_38[local_48 * 2 + 1] = 0.0;
    }
    else {
      sVar3 = FindInterval<pbrt::PiecewiseLinear2D<2ul>::Sample(pbrt::Vector2<float>,float_const*)const::_lambda(unsigned_int)_1_>
                        ((size_t)in_stack_fffffffffffffee0,
                         (anon_class_24_3_14863758 *)CONCAT44(fVar9,fVar8));
      pvVar4 = pstd::
               vector<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>,_pstd::pmr::polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>_>
               ::operator[]((vector<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>,_pstd::pmr::polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>_>
                             *)(in_RDI + 5),local_48);
      pvVar5 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                         (pvVar4,sVar3 & 0xffffffff);
      fVar10 = *pvVar5;
      pvVar4 = pstd::
               vector<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>,_pstd::pmr::polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>_>
               ::operator[]((vector<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>,_pstd::pmr::polymorphic_allocator<pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>_>_>
                             *)(in_RDI + 5),local_48);
      pvVar5 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                         (pvVar4,(ulong)((int)sVar3 + 1));
      fVar10 = Clamp<float,float,float>
                         ((*(float *)(local_28 + local_48 * 4) - fVar10) / (*pvVar5 - fVar10),0.0,
                          1.0);
      local_38[local_48 * 2 + 1] = fVar10;
      local_38[local_48 * 2] = 1.0 - local_38[local_48 * 2 + 1];
    }
  }
  sVar3 = FindInterval<pbrt::PiecewiseLinear2D<2ul>::Sample(pbrt::Vector2<float>,float_const*)const::_lambda(unsigned_int)_3_>
                    ((size_t)in_stack_fffffffffffffee0,
                     (anon_class_16_2_357700c5 *)CONCAT44(fVar9,fVar8));
  fVar10 = Sample::anon_class_24_3_1cc003bc::operator()
                     ((anon_class_24_3_1cc003bc *)
                      CONCAT44(in_stack_fffffffffffffec4,in_stack_fffffffffffffec0),
                      in_stack_fffffffffffffebc);
  local_14.y = local_14.y - fVar10;
  HProd<pbrt::Vector2,int>(in_RDI);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::data
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(in_RDI + 0x11));
  fVar11 = lookup<2UL,_0>(in_stack_fffffffffffffee0,(float *)CONCAT44(fVar9,fVar8),
                          (uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI,
                          (float *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::data
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(in_RDI + 0x11));
  uVar7 = (uint32_t)in_RDI;
  fVar12 = lookup<2UL,_0>(in_stack_fffffffffffffee0,(float *)CONCAT44(fVar9,fVar8),
                          (uint32_t)((ulong)in_RDI >> 0x20),uVar7,
                          (float *)CONCAT44(in_stack_fffffffffffffecc,in_stack_fffffffffffffec8));
  fVar10 = fVar11 - fVar12;
  std::abs(uVar7);
  if ((fVar11 + fVar12) * 0.0001 <= fVar10) {
    vfmadd213ss_fma(ZEXT416((uint)fVar11),ZEXT416((uint)fVar11),
                    ZEXT416((uint)-(local_14.y * 2.0 * (fVar11 - fVar12))));
    in_stack_fffffffffffffec8 = fVar11;
    fVar13 = SafeSqrt(0.0);
    fVar13 = in_stack_fffffffffffffec8 - fVar13;
    fVar10 = fVar11 - fVar12;
  }
  else {
    fVar13 = local_14.y * 2.0;
    fVar10 = fVar11 + fVar12;
  }
  local_14.y = fVar13 / fVar10;
  auVar15 = vfmadd213ss_fma(ZEXT416((uint)fVar11),ZEXT416((uint)(1.0 - local_14.y)),
                            ZEXT416((uint)(local_14.y * fVar12)));
  local_14.x = auVar15._0_4_ * local_14.x;
  sVar6 = FindInterval<pbrt::PiecewiseLinear2D<2ul>::Sample(pbrt::Vector2<float>,float_const*)const::_lambda(unsigned_int)_5_>
                    ((size_t)in_stack_fffffffffffffee0,
                     (anon_class_16_2_01b6dfc0 *)CONCAT44(fVar9,fVar8));
  fVar10 = Sample::anon_class_40_5_7795fd69::operator()
                     ((anon_class_40_5_7795fd69 *)CONCAT44(fVar10,in_stack_fffffffffffffec0),
                      in_stack_fffffffffffffebc);
  local_14.x = local_14.x - fVar10;
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::data
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(in_RDI + 9));
  fVar10 = lookup<2UL,_0>(in_stack_fffffffffffffee0,(float *)CONCAT44(fVar9,fVar8),
                          (uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI,
                          (float *)CONCAT44(fVar13,in_stack_fffffffffffffec8));
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::data
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(in_RDI + 9));
  fVar11 = lookup<2UL,_0>(in_stack_fffffffffffffee0,(float *)CONCAT44(fVar9,fVar8),
                          (uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI,
                          (float *)CONCAT44(fVar13,in_stack_fffffffffffffec8));
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::data
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(in_RDI + 9));
  fVar12 = lookup<2UL,_0>(in_stack_fffffffffffffee0,(float *)CONCAT44(fVar9,fVar8),
                          (uint32_t)((ulong)in_RDI >> 0x20),(uint32_t)in_RDI,
                          (float *)CONCAT44(fVar13,in_stack_fffffffffffffec8));
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::data
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)(in_RDI + 9));
  uVar7 = (uint32_t)in_RDI;
  fVar9 = lookup<2UL,_0>(in_stack_fffffffffffffee0,(float *)CONCAT44(fVar9,fVar8),
                         (uint32_t)((ulong)in_RDI >> 0x20),uVar7,
                         (float *)CONCAT44(fVar13,in_stack_fffffffffffffec8));
  dVar14 = std::fma((double)(ulong)(uint)(1.0 - local_14.y),(double)(ulong)(uint)fVar10,
                    (double)(ulong)(uint)(local_14.y * fVar12));
  fVar8 = SUB84(dVar14,0);
  dVar14 = std::fma((double)(ulong)(uint)(1.0 - local_14.y),(double)(ulong)(uint)fVar11,
                    (double)(ulong)(uint)(local_14.y * fVar9));
  fVar10 = SUB84(dVar14,0);
  fVar9 = fVar8 - fVar10;
  std::abs(uVar7);
  if ((fVar8 + fVar10) * 0.0001 <= fVar9) {
    vfmadd213ss_fma(ZEXT416((uint)fVar8),ZEXT416((uint)fVar8),
                    ZEXT416((uint)-(local_14.x * 2.0 * (fVar8 - fVar10))));
    fVar9 = fVar8;
    local_14.x = SafeSqrt(0.0);
    local_14.x = fVar9 - local_14.x;
    local_148 = fVar8 - fVar10;
  }
  else {
    local_14.x = local_14.x * 2.0;
    local_148 = fVar8 + fVar10;
  }
  auVar15._0_4_ = local_14.x / local_148;
  auVar15._4_12_ = SUB6012((undefined1  [60])0x0,0);
  local_14.x = auVar15._0_4_;
  vcvtusi2ss_avx512f(auVar15,(int)sVar6);
  vcvtusi2ss_avx512f(ZEXT416((uint)in_RDI[1].x),(int)sVar3);
  Vector2<float>::Vector2
            ((Vector2<float> *)CONCAT44(in_stack_fffffffffffffeb4,in_stack_fffffffffffffeb0),
             in_stack_fffffffffffffeac,in_stack_fffffffffffffea8);
  auVar15 = vfmadd213ss_fma(ZEXT416((uint)fVar8),ZEXT416((uint)(1.0 - local_14.x)),
                            ZEXT416((uint)(local_14.x * fVar10)));
  fVar9 = auVar15._0_4_;
  fVar8 = HProd<pbrt::Vector2,float>((Tuple2<pbrt::Vector2,_float> *)(in_RDI + 2));
  PVar1.pdf = fVar9 * fVar8;
  PVar1.p.super_Tuple2<pbrt::Vector2,_float> = local_c;
  return PVar1;
}

Assistant:

PBRT_CPU_GPU
    PLSample Sample(Vector2f sample, const Float *param = nullptr) const {
        /* Avoid degeneracies at the extrema */
        sample[0] = Clamp(sample[0], 1 - OneMinusEpsilon, OneMinusEpsilon);
        sample[1] = Clamp(sample[1], 1 - OneMinusEpsilon, OneMinusEpsilon);

        /* Look up parameter-related indices and weights (if Dimension != 0) */
        float param_weight[2 * ArraySize];
        uint32_t slice_offset = 0u;
        for (size_t dim = 0; dim < Dimension; ++dim) {
            if (m_param_size[dim] == 1) {
                param_weight[2 * dim] = 1.f;
                param_weight[2 * dim + 1] = 0.f;
                continue;
            }

            uint32_t param_index = FindInterval(m_param_size[dim], [&](uint32_t idx) {
                return m_param_values[dim].data()[idx] <= param[dim];
            });

            float p0 = m_param_values[dim][param_index],
                  p1 = m_param_values[dim][param_index + 1];

            param_weight[2 * dim + 1] = Clamp((param[dim] - p0) / (p1 - p0), 0.f, 1.f);
            param_weight[2 * dim] = 1.f - param_weight[2 * dim + 1];
            slice_offset += m_param_strides[dim] * param_index;
        }

        /* Sample the row first */
        uint32_t offset = 0;
        if (Dimension != 0)
            offset = slice_offset * m_size.y;

        auto fetch_marginal = [&](uint32_t idx) -> float {
            return lookup<Dimension>(m_marginal_cdf.data(), offset + idx, m_size.y,
                                     param_weight);
        };

        uint32_t row = FindInterval(
            m_size.y, [&](uint32_t idx) { return fetch_marginal(idx) < sample.y; });

        sample.y -= fetch_marginal(row);

        uint32_t slice_size = HProd(m_size);
        offset = row * m_size.x;
        if (Dimension != 0)
            offset += slice_offset * slice_size;

        float r0 = lookup<Dimension>(m_conditional_cdf.data(), offset + m_size.x - 1,
                                     slice_size, param_weight),
              r1 =
                  lookup<Dimension>(m_conditional_cdf.data(), offset + (m_size.x * 2 - 1),
                                    slice_size, param_weight);

        bool is_const = std::abs(r0 - r1) < 1e-4f * (r0 + r1);
        sample.y = is_const ? (2.f * sample.y)
                            : (r0 - SafeSqrt(r0 * r0 - 2.f * sample.y * (r0 - r1)));
        sample.y /= is_const ? (r0 + r1) : (r0 - r1);

        /* Sample the column next */
        sample.x *= (1.f - sample.y) * r0 + sample.y * r1;

        auto fetch_conditional = [&](uint32_t idx) -> float {
            float v0 = lookup<Dimension>(m_conditional_cdf.data(), offset + idx,
                                         slice_size, param_weight),
                  v1 = lookup<Dimension>(m_conditional_cdf.data() + m_size.x,
                                         offset + idx, slice_size, param_weight);

            return (1.f - sample.y) * v0 + sample.y * v1;
        };

        uint32_t col = FindInterval(
            m_size.x, [&](uint32_t idx) { return fetch_conditional(idx) < sample.x; });

        sample.x -= fetch_conditional(col);

        offset += col;

        float v00 = lookup<Dimension>(m_data.data(), offset, slice_size, param_weight),
              v10 =
                  lookup<Dimension>(m_data.data() + 1, offset, slice_size, param_weight),
              v01 = lookup<Dimension>(m_data.data() + m_size.x, offset, slice_size,
                                      param_weight),
              v11 = lookup<Dimension>(m_data.data() + m_size.x + 1, offset, slice_size,
                                      param_weight),
              c0 = std::fma((1.f - sample.y), v00, sample.y * v01),
              c1 = std::fma((1.f - sample.y), v10, sample.y * v11);

        is_const = std::abs(c0 - c1) < 1e-4f * (c0 + c1);
        sample.x = is_const ? (2.f * sample.x)
                            : (c0 - SafeSqrt(c0 * c0 - 2.f * sample.x * (c0 - c1)));
        sample.x /= is_const ? (c0 + c1) : (c0 - c1);

        return {Vector2f((col + sample.x) * m_patch_size.x,
                         (row + sample.y) * m_patch_size.y),
                ((1.f - sample.x) * c0 + sample.x * c1) * HProd(m_inv_patch_size)};
    }